

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O3

void thread_rwlock_trylock_peer(void *unused)

{
  int iVar1;
  undefined8 *extraout_RDX;
  uv_rwlock_t *unaff_RBX;
  int iVar2;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_80 [16];
  code *pcStack_70;
  long lStack_68;
  long lStack_60;
  undefined1 auStack_58 [16];
  uv_cond_t *puStack_48;
  long lStack_40;
  long lStack_38;
  uv_rwlock_t *puStack_30;
  
  uv_mutex_lock(&mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae7f8;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae805;
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae812;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae81f;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_rdunlock(&rwlock);
      step = step + 1;
      uv_cond_signal(&condvar);
      uv_mutex_unlock(&mutex);
      return;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_001ae7f8:
    thread_rwlock_trylock_peer_cold_2();
LAB_001ae805:
    thread_rwlock_trylock_peer_cold_3();
LAB_001ae812:
    thread_rwlock_trylock_peer_cold_4();
LAB_001ae81f:
    thread_rwlock_trylock_peer_cold_5();
  }
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  puStack_48 = (uv_cond_t *)0x1ae857;
  puStack_30 = unaff_RBX;
  uv_cond_signal(&condvar);
  iVar1 = step;
  lStack_40 = (long)step;
  do {
    puStack_48 = (uv_cond_t *)0x1ae870;
    uv_cond_wait(&condvar,&mutex);
    lStack_38 = (long)step;
  } while (iVar1 == step);
  lStack_40 = lStack_40 + 1;
  if (lStack_38 == lStack_40) {
    return;
  }
  puStack_48 = (uv_cond_t *)0x1ae8aa;
  synchronize_cold_1();
  puStack_48 = &condvar;
  iVar2 = (int)&lStack_68;
  pcStack_70 = (code *)0x1ae8c7;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_58);
  lStack_60 = (long)iVar1;
  lStack_68 = 0;
  if (lStack_60 == 0) {
    pcStack_70 = (code *)0x1ae8f1;
    iVar1 = uv_loop_init(&loop);
    lStack_60 = (long)iVar1;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_001aea97;
    pcStack_70 = (code *)0x1ae922;
    iVar1 = uv_tcp_init(&loop,&tcp_client);
    lStack_60 = (long)iVar1;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_001aeaa4;
    pcStack_70 = (code *)0x1ae95f;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,auStack_58,connect_cb);
    lStack_60 = (long)iVar1;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_001aeab1;
    pcStack_70 = (code *)0x1ae98b;
    iVar1 = uv_run(&loop,0);
    lStack_60 = (long)iVar1;
    lStack_68 = 0;
    if (lStack_60 != 0) goto LAB_001aeabe;
    lStack_60 = 1;
    lStack_68 = (long)connect_cb_called;
    if (lStack_68 != 1) goto LAB_001aeacb;
    lStack_60 = 1;
    lStack_68 = (long)read_cb_called;
    if (lStack_68 != 1) goto LAB_001aead8;
    lStack_60 = 1;
    lStack_68 = (long)write_cb_called;
    if (lStack_68 != 1) goto LAB_001aeae5;
    lStack_60 = 1;
    lStack_68 = (long)close_cb_called;
    if (lStack_68 != 1) goto LAB_001aeaf2;
    pcStack_70 = (code *)0x1aea4d;
    uv_walk(&loop,close_walk_cb,0);
    pcStack_70 = (code *)0x1aea57;
    uv_run(&loop,0);
    lStack_60 = 0;
    pcStack_70 = (code *)0x1aea68;
    iVar1 = uv_loop_close(&loop);
    lStack_68 = (long)iVar1;
    if (lStack_60 == lStack_68) {
      pcStack_70 = (code *)0x1aea82;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_70 = (code *)0x1aea97;
    run_test_not_readable_nor_writable_on_read_error_cold_1();
LAB_001aea97:
    pcStack_70 = (code *)0x1aeaa4;
    run_test_not_readable_nor_writable_on_read_error_cold_2();
LAB_001aeaa4:
    pcStack_70 = (code *)0x1aeab1;
    run_test_not_readable_nor_writable_on_read_error_cold_3();
LAB_001aeab1:
    pcStack_70 = (code *)0x1aeabe;
    run_test_not_readable_nor_writable_on_read_error_cold_4();
LAB_001aeabe:
    pcStack_70 = (code *)0x1aeacb;
    run_test_not_readable_nor_writable_on_read_error_cold_5();
LAB_001aeacb:
    pcStack_70 = (code *)0x1aead8;
    run_test_not_readable_nor_writable_on_read_error_cold_6();
LAB_001aead8:
    pcStack_70 = (code *)0x1aeae5;
    run_test_not_readable_nor_writable_on_read_error_cold_7();
LAB_001aeae5:
    pcStack_70 = (code *)0x1aeaf2;
    run_test_not_readable_nor_writable_on_read_error_cold_8();
LAB_001aeaf2:
    pcStack_70 = (code *)0x1aeaff;
    run_test_not_readable_nor_writable_on_read_error_cold_9();
  }
  pcStack_70 = connect_cb;
  run_test_not_readable_nor_writable_on_read_error_cold_10();
  connect_cb_called = connect_cb_called + 1;
  auStack_80._0_8_ = SEXT48(iVar2);
  if (auStack_80._0_8_ == 0) {
    iVar1 = uv_read_start(&tcp_client,alloc_cb,read_cb);
    auStack_80._0_8_ = SEXT48(iVar1);
    if (auStack_80._0_8_ == 0) {
      auStack_80 = uv_buf_init(reset_me_cmd,3);
      iVar1 = uv_write(&write_req,&tcp_client,auStack_80,1,write_cb);
      pcStack_70 = (code *)0x0;
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001aebeb;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001aebeb:
  connect_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x40;
  return;
}

Assistant:

static void thread_rwlock_trylock_peer(void* unused) {
  (void) &unused;

  uv_mutex_lock(&mutex);

  /* Write lock held by other thread. */
  ASSERT_EQ(UV_EBUSY, uv_rwlock_tryrdlock(&rwlock));
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Read lock held by other thread. */
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  uv_rwlock_rdunlock(&rwlock);
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Acquire write lock. */
  ASSERT_OK(uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Release write lock and acquire read lock. */
  uv_rwlock_wrunlock(&rwlock);
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  synchronize();

  uv_rwlock_rdunlock(&rwlock);
  synchronize_nowait();  /* Signal main thread we're going away. */
  uv_mutex_unlock(&mutex);
}